

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btConvexHullComputer.cpp
# Opt level: O2

void __thiscall
btConvexHullInternal::Rational128::Rational128
          (Rational128 *this,Int128 *numerator,Int128 *denominator)

{
  uint64_t uVar1;
  int iVar2;
  Int128 IVar3;
  
  iVar2 = Int128::getSign(numerator);
  this->sign = iVar2;
  if (iVar2 < 0) {
    IVar3 = Int128::operator-(numerator);
    this->numerator = IVar3;
  }
  else {
    uVar1 = numerator->high;
    (this->numerator).low = numerator->low;
    (this->numerator).high = uVar1;
  }
  iVar2 = Int128::getSign(denominator);
  if (iVar2 < 0) {
    this->sign = -this->sign;
    IVar3 = Int128::operator-(denominator);
    this->denominator = IVar3;
  }
  else {
    uVar1 = denominator->high;
    (this->denominator).low = denominator->low;
    (this->denominator).high = uVar1;
  }
  this->isInt64 = false;
  return;
}

Assistant:

Rational128(const Int128& numerator, const Int128& denominator)
				{
					sign = numerator.getSign();
					if (sign >= 0)
					{
						this->numerator = numerator;
					}
					else
					{
						this->numerator = -numerator;
					}
					int dsign = denominator.getSign();
					if (dsign >= 0)
					{
						this->denominator = denominator;
					}
					else
					{
						sign = -sign;
						this->denominator = -denominator;
					}
					isInt64 = false;
				}